

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O2

Level * __thiscall
hta::Metric::restore_level(Level *__return_storage_ptr__,Metric *this,Duration interval)

{
  _Head_base<0UL,_hta::storage::Metric_*,_false> _Var1;
  TimeValue tv;
  TimeAggregate ta;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Duration DVar3;
  long lVar4;
  iterator __begin3;
  undefined8 uVar5;
  pointer pTVar6;
  vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> data;
  _Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> local_98 [2];
  long local_60;
  Value VStack_58;
  Value VStack_50;
  Value VStack_48;
  uint64_t uStack_40;
  Value local_38;
  rep rStack_30;
  
  (__return_storage_ptr__->time_current).
  super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r =
       0;
  (__return_storage_ptr__->aggregate).minimum = INFINITY;
  (__return_storage_ptr__->aggregate).maximum = -INFINITY;
  (__return_storage_ptr__->aggregate).sum = 0.0;
  (__return_storage_ptr__->aggregate).count = 0;
  (__return_storage_ptr__->aggregate).integral = 0.0;
  (__return_storage_ptr__->aggregate).active_time.__r = 0;
  iVar2 = (*((this->storage_metric_)._M_t.
             super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>
             ._M_t.
             super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>
             .super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl)->_vptr_Metric[10])
                    ();
  if (CONCAT44(extraout_var,iVar2) != 0) {
    uVar5 = 0x300000001;
    _Var1._M_head_impl =
         (this->storage_metric_)._M_t.
         super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>.
         _M_t.
         super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>.
         super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl;
    iVar2 = (*(_Var1._M_head_impl)->_vptr_Metric[0xb])(_Var1._M_head_impl,interval.__r);
    if (CONCAT44(extraout_var_00,iVar2) == 0) {
      uVar5 = 0x300000003;
      lVar4 = 0;
    }
    else {
      _Var1._M_head_impl =
           (this->storage_metric_)._M_t.
           super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>.
           _M_t.
           super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>
           .super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl;
      (*(_Var1._M_head_impl)->_vptr_Metric[9])(local_98,_Var1._M_head_impl,interval.__r);
      lVar4 = (long)&((local_98[0]._M_impl.super__Vector_impl_data._M_start)->time).
                     super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     .__d.__r + interval.__r;
      (__return_storage_ptr__->time_current).
      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
      __r = lVar4;
    }
    if ((this->interval_min_).__r == interval.__r) {
      _Var1._M_head_impl =
           (this->storage_metric_)._M_t.
           super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>.
           _M_t.
           super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>
           .super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl;
      (*(_Var1._M_head_impl)->_vptr_Metric[5])(local_98,_Var1._M_head_impl,lVar4,0,uVar5);
      if (local_98[0]._M_impl.super__Vector_impl_data._M_start !=
          local_98[0]._M_impl.super__Vector_impl_data._M_finish) {
        pTVar6 = local_98[0]._M_impl.super__Vector_impl_data._M_start;
        if ((__return_storage_ptr__->time_current).
            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            .__d.__r == 0) {
          (__return_storage_ptr__->time_current).
          super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
          __d.__r = ((local_98[0]._M_impl.super__Vector_impl_data._M_start)->time).
                    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    .__d.__r;
        }
        for (; pTVar6 != local_98[0]._M_impl.super__Vector_impl_data._M_finish;
            pTVar6 = (pointer)&(pTVar6->aggregate).maximum) {
          tv.time.
          super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
          __d.__r = (pTVar6->time).
                    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          ;
          tv.value = (pTVar6->aggregate).minimum;
          Level::advance(__return_storage_ptr__,tv);
        }
      }
      Catch::clara::std::_Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>::
      ~_Vector_base((_Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_> *)local_98);
    }
    else {
      DVar3 = operator/(interval,(IntervalFactor)(this->interval_factor_).factor_);
      _Var1._M_head_impl =
           (this->storage_metric_)._M_t.
           super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>.
           _M_t.
           super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>
           .super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl;
      (*(_Var1._M_head_impl)->_vptr_Metric[6])(local_98,_Var1._M_head_impl,lVar4,0,DVar3.__r,uVar5);
      for (pTVar6 = local_98[0]._M_impl.super__Vector_impl_data._M_start;
          pTVar6 != local_98[0]._M_impl.super__Vector_impl_data._M_finish; pTVar6 = pTVar6 + 1) {
        local_60 = (pTVar6->time).
                   super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   .__d.__r + DVar3.__r;
        VStack_58 = (pTVar6->aggregate).minimum;
        VStack_50 = (pTVar6->aggregate).maximum;
        VStack_48 = (pTVar6->aggregate).sum;
        uStack_40 = (pTVar6->aggregate).count;
        local_38 = (pTVar6->aggregate).integral;
        rStack_30 = (pTVar6->aggregate).active_time.__r;
        ta.aggregate.minimum = VStack_58;
        ta.time.
        super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d
        .__r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
               (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
               local_60;
        ta.aggregate.maximum = VStack_50;
        ta.aggregate.sum = VStack_48;
        ta.aggregate.count = uStack_40;
        ta.aggregate.integral = local_38;
        ta.aggregate.active_time.__r = rStack_30;
        Level::advance(__return_storage_ptr__,ta);
      }
      std::_Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::~_Vector_base
                (local_98);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Level Metric::restore_level(Duration interval)
{
    Level level;
    if (storage_metric_->size() == 0)
    {
        // No need to restore anything.
        return level;
    }

    // How much did we already store here?
    TimePoint time_closed;
    Scope scope_begin = Scope::infinity;
    if (storage_metric_->size(interval))
    {
        time_closed = storage_metric_->last(interval).time + interval;
        scope_begin = Scope ::closed;
        level.time_current = time_closed;
    }

    if (interval == interval_min_)
    {
        auto data =
            storage_metric_->get(time_closed, {}, IntervalScope{ scope_begin, Scope::infinity });
        if (!data.empty())
        {
            if (!level.time_current)
            {
                level.time_current = data[0].time;
            }
            for (auto& tv : data)
            {
                level.advance(tv);
            }
        }
    }
    else
    {
        auto smaller_interval = interval / interval_factor_;
        auto data = storage_metric_->get(time_closed, {}, smaller_interval,
                                         IntervalScope{ scope_begin, Scope::infinity });
        for (auto& ta : data)
        {
            level.advance({ ta.time + smaller_interval, ta.aggregate });
        }
    }
    return level;
}